

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::BasicWriter<char>::write_int<int,fmt::FormatSpec>
          (BasicWriter<char> *this,int value,FormatSpec spec)

{
  char code;
  undefined4 uVar1;
  uint in_EAX;
  byte *pbVar2;
  CharPtr pcVar3;
  undefined1 uVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  char *pcVar10;
  uint uVar11;
  long lVar12;
  char prefix [4];
  undefined8 uStack_18;
  
  uVar1 = spec._20_4_;
  uVar7 = (ulong)(uint)value;
  uStack_18 = (ulong)in_EAX;
  if (value < 0) {
    uStack_18._0_5_ = CONCAT14(0x2d,in_EAX);
    uVar7 = (ulong)(uint)-value;
LAB_001c0072:
    uStack_18 = (ulong)(uint5)uStack_18;
    lVar12 = 1;
  }
  else {
    lVar12 = 0;
    if (((undefined1  [24])spec & (undefined1  [24])0x100000000) != (undefined1  [24])0x0) {
      uVar4 = 0x2b;
      if (((undefined1  [24])spec & (undefined1  [24])0x200000000) == (undefined1  [24])0x0) {
        uVar4 = 0x20;
      }
      uStack_18._0_5_ = CONCAT14(uVar4,in_EAX);
      goto LAB_001c0072;
    }
  }
  uVar11 = (uint)lVar12;
  code = spec.type_;
  uVar8 = (uint)uVar7;
  spec._20_4_ = uVar1;
  if ((byte)spec.type_ < 0x62) {
    if (spec.type_ == '\0') {
LAB_001c01a7:
      uVar9 = 0x1f;
      if ((uVar8 | 1) != 0) {
        for (; (uVar8 | 1) >> uVar9 == 0; uVar9 = uVar9 - 1) {
        }
      }
      uVar9 = (uVar9 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
      pcVar3 = prepare_int_buffer<fmt::FormatSpec>
                         (this,(uVar9 - (uVar8 < internal::BasicData<void>::POWERS_OF_10_32[uVar9]))
                               + 1,&spec,(char *)((long)&uStack_18 + 4),uVar11);
      pcVar3 = pcVar3 + 1;
      if (99 < uVar8) {
        do {
          uVar11 = (uint)uVar7;
          uVar8 = (uint)(uVar7 / 100);
          uVar7 = uVar7 / 100;
          *(undefined2 *)(pcVar3 + -2) =
               *(undefined2 *)
                (
                "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                + (ulong)(uVar11 + (int)uVar7 * -100) * 2);
          pcVar3 = pcVar3 + -2;
        } while (9999 < uVar11);
      }
      if (uVar8 < 10) {
        bVar5 = (byte)uVar8 | 0x30;
        lVar12 = -1;
      }
      else {
        pcVar3[-1] = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                     [((ulong)uVar8 * 2 & 0xffffffff) + 1];
        bVar5 = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                [(ulong)uVar8 * 2];
        lVar12 = -2;
      }
      pcVar3[lVar12] = bVar5;
      return;
    }
    if (spec.type_ == 'B') goto LAB_001c0151;
    if (spec.type_ == 'X') goto LAB_001c00e0;
  }
  else if ((byte)spec.type_ < 0x6f) {
    if (spec.type_ == 'b') {
LAB_001c0151:
      if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
        *(undefined1 *)((long)&uStack_18 + lVar12 + 4) = 0x30;
        uVar11 = uVar11 | 2;
        *(char *)((long)&uStack_18 + lVar12 + 5) = spec.type_;
      }
      uVar8 = 0;
      uVar6 = uVar7;
      do {
        uVar8 = uVar8 + 1;
        uVar9 = (uint)uVar6;
        uVar6 = uVar6 >> 1;
      } while (1 < uVar9);
      pbVar2 = (byte *)prepare_int_buffer<fmt::FormatSpec>
                                 (this,uVar8,&spec,(char *)((long)&uStack_18 + 4),uVar11);
      do {
        uVar8 = (uint)uVar7;
        *pbVar2 = (byte)uVar7 & 1 | 0x30;
        pbVar2 = pbVar2 + -1;
        uVar7 = uVar7 >> 1;
      } while (1 < uVar8);
      return;
    }
    if (spec.type_ == 'd') goto LAB_001c01a7;
  }
  else {
    if (spec.type_ == 'o') {
      if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
        uVar11 = uVar11 + 1;
        *(undefined1 *)((long)&uStack_18 + lVar12 + 4) = 0x30;
      }
      uVar8 = 0;
      uVar6 = uVar7;
      do {
        uVar8 = uVar8 + 1;
        uVar9 = (uint)uVar6;
        uVar6 = uVar6 >> 3;
      } while (7 < uVar9);
      pbVar2 = (byte *)prepare_int_buffer<fmt::FormatSpec>
                                 (this,uVar8,&spec,(char *)((long)&uStack_18 + 4),uVar11);
      do {
        uVar8 = (uint)uVar7;
        *pbVar2 = (byte)uVar7 & 7 | 0x30;
        pbVar2 = pbVar2 + -1;
        uVar7 = uVar7 >> 3;
      } while (7 < uVar8);
      return;
    }
    if (spec.type_ == 'x') {
LAB_001c00e0:
      if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
        *(undefined1 *)((long)&uStack_18 + lVar12 + 4) = 0x30;
        uVar11 = uVar11 | 2;
        *(char *)((long)&uStack_18 + lVar12 + 5) = spec.type_;
      }
      uVar8 = 0;
      uVar6 = uVar7;
      do {
        uVar8 = uVar8 + 1;
        uVar9 = (uint)uVar6;
        uVar6 = uVar6 >> 4;
      } while (0xf < uVar9);
      pcVar3 = prepare_int_buffer<fmt::FormatSpec>
                         (this,uVar8,&spec,(char *)((long)&uStack_18 + 4),uVar11);
      pcVar10 = "0123456789ABCDEF";
      if (spec.type_ == 'x') {
        pcVar10 = "0123456789abcdef";
      }
      do {
        uVar8 = (uint)uVar7;
        *pcVar3 = pcVar10[uVar8 & 0xf];
        pcVar3 = pcVar3 + -1;
        uVar7 = uVar7 >> 4;
      } while (0xf < uVar8);
      return;
    }
  }
  pcVar10 = "char";
  if (((undefined1  [24])spec & (undefined1  [24])0x1000000000) == (undefined1  [24])0x0) {
    pcVar10 = "integer";
  }
  internal::report_unknown_type(code,pcVar10);
}

Assistant:

void BasicWriter<Char>::write_int(T value, Spec spec) {
  unsigned prefix_size = 0;
  typedef typename internal::IntTraits<T>::MainType UnsignedType;
  UnsignedType abs_value = value;
  char prefix[4] = "";
  if (internal::is_negative(value)) {
    prefix[0] = '-';
    ++prefix_size;
    abs_value = 0 - abs_value;
  } else if (spec.flag(SIGN_FLAG)) {
    prefix[0] = spec.flag(PLUS_FLAG) ? '+' : ' ';
    ++prefix_size;
  }
  switch (spec.type()) {
  case 0: case 'd': {
    unsigned num_digits = internal::count_digits(abs_value);
    CharPtr p = prepare_int_buffer(
      num_digits, spec, prefix, prefix_size) + 1 - num_digits;
    internal::format_decimal(get(p), abs_value, num_digits);
    break;
  }
  case 'x': case 'X': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 4) != 0);
    Char *p = get(prepare_int_buffer(
      num_digits, spec, prefix, prefix_size));
    n = abs_value;
    const char *digits = spec.type() == 'x' ?
        "0123456789abcdef" : "0123456789ABCDEF";
    do {
      *p-- = digits[n & 0xf];
    } while ((n >>= 4) != 0);
    break;
  }
  case 'b': case 'B': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 1) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 1));
    } while ((n >>= 1) != 0);
    break;
  }
  case 'o': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG))
      prefix[prefix_size++] = '0';
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 3) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 7));
    } while ((n >>= 3) != 0);
    break;
  }
  default:
    internal::report_unknown_type(
      spec.type(), spec.flag(CHAR_FLAG) ? "char" : "integer");
    break;
  }
}